

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [4],int *args_4,char *args_5,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_350;
  cmAlphaNum local_318;
  cmAlphaNum local_2e0;
  cmAlphaNum local_2a8;
  cmAlphaNum local_270;
  cmAlphaNum local_238;
  cmAlphaNum local_200;
  cmAlphaNum local_1c8;
  cmAlphaNum local_190;
  cmAlphaNum local_158;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_120;
  string_view local_108;
  string *local_f8;
  string_view local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string_view local_d8;
  string *local_c8;
  string_view local_c0;
  string *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  local_158.RValueString_ = (string *)0x0;
  local_158.View_._M_str = (a->_M_dataplus)._M_p;
  local_158.View_._M_len = a->_M_string_length;
  local_120.first = cmAlphaNum::View(&local_158);
  local_120.second = local_158.RValueString_;
  local_2e0.Digits_[0] = *b;
  local_2e0.View_._M_str = local_2e0.Digits_;
  local_2e0.RValueString_ = (string *)0x0;
  local_2e0.View_._M_len = 1;
  local_108 = cmAlphaNum::View(&local_2e0);
  local_f8 = local_2e0.RValueString_;
  local_190.View_._M_len = 0;
  local_190.View_._M_str = (char *)0x0;
  local_190.RValueString_ = args;
  local_f0 = cmAlphaNum::View(&local_190);
  local_e0 = local_190.RValueString_;
  local_318.Digits_[0] = *args_1;
  local_318.View_._M_str = local_318.Digits_;
  local_318.RValueString_ = (string *)0x0;
  local_318.View_._M_len = 1;
  local_d8 = cmAlphaNum::View(&local_318);
  local_c8 = local_318.RValueString_;
  local_1c8.RValueString_ = (string *)0x0;
  local_1c8.View_._M_str = (args_2->_M_dataplus)._M_p;
  local_1c8.View_._M_len = args_2->_M_string_length;
  local_c0 = cmAlphaNum::View(&local_1c8);
  local_b0 = local_1c8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_200,*args_3);
  local_a8 = cmAlphaNum::View(&local_200);
  local_98 = local_200.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_238,*args_4);
  local_90 = cmAlphaNum::View(&local_238);
  local_80 = local_238.RValueString_;
  local_350.Digits_[0] = *args_5;
  local_350.View_._M_str = local_350.Digits_;
  local_350.RValueString_ = (string *)0x0;
  local_350.View_._M_len = 1;
  local_78 = cmAlphaNum::View(&local_350);
  local_68 = local_350.RValueString_;
  local_270.RValueString_ = (string *)0x0;
  local_270.View_._M_str = (args_6->_M_dataplus)._M_p;
  local_270.View_._M_len = args_6->_M_string_length;
  local_60 = cmAlphaNum::View(&local_270);
  local_50 = local_270.RValueString_;
  local_2a8.RValueString_ = (string *)0x0;
  local_2a8.View_._M_str = (args_7->_M_dataplus)._M_p;
  local_2a8.View_._M_len = args_7->_M_string_length;
  local_48 = cmAlphaNum::View(&local_2a8);
  local_38 = local_2a8.RValueString_;
  views._M_len = 10;
  views._M_array = &local_120;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}